

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSEQEncStart(der_anchor_t *anchor,octet *der,size_t pos,u32 tag)

{
  bool_t bVar1;
  size_t sVar2;
  
  bVar1 = derTIsValid(tag);
  if (bVar1 != 0) {
    bVar1 = derTIsConstructive(tag);
    if (bVar1 != 0) {
      anchor->der = der;
      anchor->pos = pos;
      anchor->tag = tag;
      anchor->len = 0;
      sVar2 = derEnc(der,tag,(void *)0x0,0);
      return sVar2;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t derTSEQEncStart(der_anchor_t* anchor, octet der[], size_t pos, u32 tag)
{
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// проверить тег
	if (!derTIsValid(tag) || !derTIsConstructive(tag))
		return SIZE_MAX;
	// бросить якорь
	anchor->der = der;
	anchor->pos = pos;
	anchor->tag = tag;
	anchor->len = 0;
	// кодировать пустую (пока) структуру
	return derEnc(der, tag, 0, 0);
}